

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

Gia_Man_t * Lf_ManDeriveMapping(Lf_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *__ptr;
  Lf_Cut_t *pLVar4;
  int iVar5;
  size_t __size;
  long lVar6;
  int iVar7;
  ulong uVar8;
  Gia_Man_t *pGVar9;
  
  pJVar2 = p->pPars;
  if ((pJVar2->fCutMin != 0) || (pGVar9 = p->pGia, pGVar9->vMapping != (Vec_Int_t *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x6b2,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
  }
  uVar3 = pGVar9->nObjs;
  iVar7 = (int)pJVar2->Edge + uVar3;
  iVar1 = (int)pJVar2->Area;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < (uint)(iVar7 + -1 + iVar1 * 2)) {
    iVar5 = iVar7 + iVar1 * 2;
  }
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    p_00->pArray = (int *)0x0;
    if ((int)uVar3 < 1) goto LAB_0076bd59;
    __size = (ulong)uVar3 * 4;
LAB_0076bd2a:
    __ptr = (int *)malloc(__size);
LAB_0076bd32:
    p_00->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar3;
  }
  else {
    __ptr = (int *)malloc((long)iVar5 << 2);
    p_00->pArray = __ptr;
    if (iVar5 < (int)uVar3) {
      __size = (long)(int)uVar3 << 2;
      if (__ptr == (int *)0x0) goto LAB_0076bd2a;
      __ptr = (int *)realloc(__ptr,__size);
      goto LAB_0076bd32;
    }
  }
  if (0 < (int)uVar3) {
    memset(__ptr,0,(ulong)uVar3 * 4);
  }
LAB_0076bd59:
  p_00->nSize = uVar3;
  if (0 < pGVar9->nObjs) {
    lVar6 = 0;
    do {
      uVar3 = (uint)*(undefined8 *)(pGVar9->pObjs + lVar6);
      if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
        if ((p->vOffsets).nSize <= lVar6) {
LAB_0076be97:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = (p->vOffsets).pArray[lVar6];
        if (((long)iVar1 < 0) || ((p->vMapRefs).nSize <= iVar1)) goto LAB_0076be97;
        if ((p->vMapRefs).pArray[iVar1] != 0) {
          if (((uVar3 & 0x1fffffff) != 0x1fffffff) &&
             ((uVar3 & 0x1fffffff) ==
              ((uint)((ulong)*(undefined8 *)(pGVar9->pObjs + lVar6) >> 0x20) & 0x1fffffff))) {
            __assert_fail("!Gia_ObjIsBuf(Gia_ManObj(p->pGia,i))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                          ,0x6b9,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
          }
          pLVar4 = Lf_ObjCutBest(p,(int)lVar6);
          if ((pLVar4->field_0x16 & 0x80) != 0) {
            __assert_fail("!pCut->fMux7",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                          ,0x6bb,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
          }
          if (p_00->nSize <= lVar6) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          p_00->pArray[lVar6] = p_00->nSize;
          Vec_IntPush(p_00,(uint)(byte)pLVar4->field_0x17);
          if (0xffffff < *(uint *)&pLVar4->field_0x14) {
            uVar8 = 0;
            do {
              Vec_IntPush(p_00,*(int *)((long)&pLVar4[1].Sign + uVar8 * 4));
              uVar8 = uVar8 + 1;
            } while (uVar8 < (byte)pLVar4->field_0x17);
          }
          Vec_IntPush(p_00,(int)lVar6);
          pGVar9 = p->pGia;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pGVar9->nObjs);
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x6c2,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
  }
  pGVar9->vMapping = p_00;
  return pGVar9;
}

Assistant:

Gia_Man_t * Lf_ManDeriveMapping( Lf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Lf_Cut_t * pCut;
    int i, k;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        assert( !Gia_ObjIsBuf(Gia_ManObj(p->pGia,i)) );
        pCut = Lf_ObjCutBest( p, i );
        assert( !pCut->fMux7 );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, pCut->nLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_IntPush( vMapping, pCut->pLeaves[k] );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    return p->pGia;
}